

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::ReadLinetypeSegment(ON_BinaryArchive *this,ON_LinetypeSegment *seg)

{
  undefined8 uVar1;
  uint uVar2;
  undefined8 uVar3;
  bool bVar4;
  eSegType eVar5;
  uint i;
  uint local_24;
  
  uVar1 = ON_LinetypeSegment::OneMillimeterLine._8_8_;
  seg->m_length = ON_LinetypeSegment::OneMillimeterLine.m_length;
  uVar3 = ON_LinetypeSegment::OneMillimeterLine._8_8_;
  ON_LinetypeSegment::OneMillimeterLine.m_seg_type = (eSegType)uVar1;
  ON_LinetypeSegment::OneMillimeterLine.m_reserved2 = SUB84(uVar1,4);
  uVar2 = ON_LinetypeSegment::OneMillimeterLine.m_reserved2;
  seg->m_seg_type = ON_LinetypeSegment::OneMillimeterLine.m_seg_type;
  ON_LinetypeSegment::OneMillimeterLine._8_8_ = uVar3;
  seg->m_reserved2 = uVar2;
  bVar4 = ReadDouble(this,1,&seg->m_length);
  if (bVar4) {
    local_24 = 0;
    bVar4 = ReadInt32(this,1,(ON__INT32 *)&local_24);
    if (local_24 == 0xffffffff) {
      local_24 = 0;
    }
    else if (local_24 == 1) {
      local_24 = 2;
    }
    else if (local_24 == 0) {
      local_24 = 1;
    }
    eVar5 = ON_LinetypeSegment::SegmentTypeFromUnsigned(local_24);
    seg->m_seg_type = eVar5;
  }
  return bVar4;
}

Assistant:

bool ON_BinaryArchive::ReadLinetypeSegment(ON_LinetypeSegment& seg)
{
  seg = ON_LinetypeSegment::OneMillimeterLine;
  bool rc = ReadDouble(&seg.m_length);
  if (rc)
  {
    // ON_LinetypeSegment::eSegType::Unset was not added initialy, so juggling values is required for
    // Unset, stLine and stSpace.  Any future values with work without
    // juggling.
    unsigned int i = 0;
    rc = ReadInt(&i);
    switch (i)
    {
    case 0:
      i = static_cast<unsigned int>(ON_LinetypeSegment::eSegType::stLine);
      break;
    case 1:
      i = static_cast<unsigned int>(ON_LinetypeSegment::eSegType::stSpace);
      break;
    case ON_UNSET_UINT_INDEX:
      i = static_cast<unsigned int>(ON_LinetypeSegment::eSegType::Unset);
      break;
    }
    seg.m_seg_type = ON_LinetypeSegment::SegmentTypeFromUnsigned(i);
  }
  return rc;
}